

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_read_scores_internal(acmod_t *acmod)

{
  FILE *__stream;
  int16 *piVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int16 n_active;
  short local_22;
  
  local_22 = (short)((ulong)in_RAX >> 0x30);
  __stream = (FILE *)acmod->insenfh;
  if (acmod->n_feat_frame == acmod->n_feat_alloc) {
    if (acmod->grow_feat == '\0') {
      return 0;
    }
    acmod_grow_feat_buf(acmod,acmod->n_feat_alloc * 2);
  }
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  sVar4 = fread(&local_22,2,1,__stream);
  if (sVar4 == 1) {
    acmod->n_senone_active = (int)local_22;
    if (acmod->mdef->n_sen == (int)local_22) {
      sVar4 = fread(acmod->senone_scores,2,(long)local_22,__stream);
      if (sVar4 == (long)acmod->n_senone_active) {
        return 1;
      }
    }
    else {
      sVar4 = fread(acmod->senone_active,1,(long)local_22,__stream);
      if (sVar4 == (long)acmod->n_senone_active) {
        if (acmod->n_senone_active < 1) {
          uVar7 = 0;
        }
        else {
          lVar6 = 0;
          uVar2 = 0;
          do {
            uVar7 = uVar2 + acmod->senone_active[lVar6];
            if (1 < acmod->senone_active[lVar6]) {
              piVar1 = acmod->senone_scores;
              uVar5 = (ulong)(uVar2 + 1);
              do {
                piVar1[uVar5] = 0x7fff;
                uVar5 = uVar5 + 1;
              } while (uVar5 < uVar7);
            }
            sVar4 = fread(acmod->senone_scores + uVar7,2,1,__stream);
            if (sVar4 != 1) goto LAB_0011bee9;
            lVar6 = lVar6 + 1;
            uVar2 = uVar7;
          } while (lVar6 < acmod->n_senone_active);
        }
        iVar3 = acmod->mdef->n_sen;
        if ((int)(uVar7 + 1) < iVar3) {
          piVar1 = acmod->senone_scores;
          lVar6 = 1;
          do {
            piVar1[(int)uVar7 + lVar6] = 0x7fff;
            lVar6 = lVar6 + 1;
          } while (iVar3 - uVar7 != (int)lVar6);
          return 1;
        }
        return 1;
      }
    }
  }
LAB_0011bee9:
  iVar3 = ferror(__stream);
  if (iVar3 == 0) {
    return 0;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                 ,0x3d0,"Failed to read frame from senone file");
  return -1;
}

Assistant:

static int
acmod_read_scores_internal(acmod_t *acmod)
{
    FILE *senfh = acmod->insenfh;
    int16 n_active;
    size_t rv;

    if (acmod->n_feat_frame == acmod->n_feat_alloc) {
        if (acmod->grow_feat)
            acmod_grow_feat_buf(acmod, acmod->n_feat_alloc * 2);
        else
            return 0;
    }

    if (senfh == NULL)
        return -1;
    
    if ((rv = fread(&n_active, 2, 1, senfh)) != 1)
        goto error_out;

    acmod->n_senone_active = n_active;
    if (acmod->n_senone_active == bin_mdef_n_sen(acmod->mdef)) {
        if ((rv = fread(acmod->senone_scores, 2,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;
    }
    else {
        int i, n;
        
        if ((rv = fread(acmod->senone_active, 1,
                        acmod->n_senone_active, senfh))
            != (size_t) acmod->n_senone_active)
            goto error_out;

        for (i = 0, n = 0; i < acmod->n_senone_active; ++i) {
            int j, sen = n + acmod->senone_active[i];
            for (j = n + 1; j < sen; ++j)
                acmod->senone_scores[j] = SENSCR_DUMMY;
            
            if ((rv = fread(acmod->senone_scores + sen, 2, 1, senfh)) != 1)
                goto error_out;
            
            n = sen;
        }

        n++;
        while (n < bin_mdef_n_sen(acmod->mdef))
            acmod->senone_scores[n++] = SENSCR_DUMMY;
    }
    return 1;

error_out:
    if (ferror(senfh)) {
        E_ERROR_SYSTEM("Failed to read frame from senone file");
        return -1;
    }
    return 0;
}